

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vec.h
# Opt level: O2

void __thiscall
Minisat::vec<Minisat::vec<unsigned_int,_int>,_int>::clear
          (vec<Minisat::vec<unsigned_int,_int>,_int> *this,bool dealloc)

{
  long lVar1;
  Size i;
  long lVar2;
  
  if (this->data != (vec<unsigned_int,_int> *)0x0) {
    lVar1 = 0;
    for (lVar2 = 0; lVar2 < this->sz; lVar2 = lVar2 + 1) {
      vec<unsigned_int,_int>::~vec((vec<unsigned_int,_int> *)((long)&this->data->data + lVar1));
      lVar1 = lVar1 + 0x10;
    }
    this->sz = 0;
    if (dealloc) {
      free(this->data);
      this->data = (vec<unsigned_int,_int> *)0x0;
      this->cap = 0;
    }
  }
  return;
}

Assistant:

void vec<T,_Size>::clear(bool dealloc) {
    if (data != NULL){
        for (Size i = 0; i < sz; i++) data[i].~T();
        sz = 0;
        if (dealloc) free(data), data = NULL, cap = 0; } }